

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O1

void tinfzlib(void)

{
  int iVar1;
  long lVar2;
  uchar *source;
  ulong uVar3;
  uchar out [1];
  char suffix [32];
  uint local_13c;
  uint local_138 [66];
  
  iVar1 = greatest_test_pre("zlib_empty_raw");
  if (iVar1 == 1) {
    local_138[0] = 0;
    iVar1 = tinf_zlib_uncompress("",local_138,zlib_empty_raw_data,0xb);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (iVar1 == 0 && local_138[0] == 0) {
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
      greatest_info.fail_line = 0x1f7;
      greatest_info.msg = "res == TINF_OK && dlen == 0";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00102678;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("zlib_empty_fixed");
  if (iVar1 == 1) {
    local_138[0] = 0;
    iVar1 = tinf_zlib_uncompress("",local_138,&zlib_empty_fixed_data,8);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (iVar1 == 0 && local_138[0] == 0) {
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
      greatest_info.fail_line = 0x207;
      greatest_info.msg = "res == TINF_OK && dlen == 0";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00102678;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("zlib_empty_dynamic");
  if (iVar1 == 1) {
    local_138[0] = 0;
    iVar1 = tinf_zlib_uncompress("",local_138,zlib_empty_dynamic_data,0x12);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (iVar1 == 0 && local_138[0] == 0) {
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
      greatest_info.fail_line = 0x218;
      greatest_info.msg = "res == TINF_OK && dlen == 0";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00102678;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("zlib_onebyte_raw");
  if (iVar1 == 1) {
    local_13c = CONCAT31(local_13c._1_3_,0xff);
    local_138[0] = 1;
    iVar1 = tinf_zlib_uncompress(&local_13c,local_138,zlib_onebyte_raw_data,0xc);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar1 == 0) && (local_138[0] == 1)) && ((char)local_13c == '\0')) {
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
      greatest_info.fail_line = 0x22a;
      greatest_info.msg = "res == TINF_OK && dlen == 1 && out[0] == 0";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00102678;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("zlib_onebyte_fixed");
  if (iVar1 == 1) {
    local_13c = CONCAT31(local_13c._1_3_,0xff);
    local_138[0] = 1;
    iVar1 = tinf_zlib_uncompress(&local_13c,local_138,zlib_onebyte_fixed_data,9);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar1 == 0) && (local_138[0] == 1)) && ((char)local_13c == '\0')) {
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
      greatest_info.fail_line = 0x23b;
      greatest_info.msg = "res == TINF_OK && dlen == 1 && out[0] == 0";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00102678;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("zlib_onebyte_dynamic");
  if (iVar1 == 1) {
    local_13c = CONCAT31(local_13c._1_3_,0xff);
    local_138[0] = 1;
    iVar1 = tinf_zlib_uncompress(&local_13c,local_138,zlib_onebyte_dynamic_data,0x12);
    greatest_info.assertions = greatest_info.assertions + 1;
    if (((iVar1 == 0) && (local_138[0] == 1)) && ((char)local_13c == '\0')) {
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
      greatest_info.fail_line = 0x24d;
      greatest_info.msg = "res == TINF_OK && dlen == 1 && out[0] == 0";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00102678;
    }
    greatest_test_post(iVar1);
  }
  iVar1 = greatest_test_pre("zlib_zeroes");
  if (iVar1 == 1) {
    local_13c = 0x100;
    memset(local_138,0xff,0x100);
    iVar1 = tinf_zlib_uncompress(local_138,&local_13c,zlib_zeroes_data,0xc);
    greatest_info.assertions = greatest_info.assertions + 1;
    if ((iVar1 == 0) && (local_13c == 0x100)) {
      lVar2 = 0;
      do {
        if (*(char *)((long)local_138 + lVar2) != '\0') {
          greatest_info.fail_line = 0x266;
          greatest_info.msg = (char *)0x0;
          goto LAB_0010258a;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x100);
      greatest_info.msg = (char *)0x0;
      iVar1 = 0;
    }
    else {
      greatest_info.fail_line = 0x262;
      greatest_info.msg = "res == TINF_OK && dlen == ARRAY_SIZE(out)";
LAB_0010258a:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
      iVar1 = -1;
      if ((greatest_info.flags & 4) != 0) {
LAB_00102678:
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
        abort();
      }
    }
    greatest_test_post(iVar1);
  }
  source = zlib_errors[0].data;
  uVar3 = 0;
  do {
    sprintf((char *)local_138,"%d",uVar3 & 0xffffffff);
    greatest_info.name_suffix = (char *)local_138;
    iVar1 = greatest_test_pre("zlib_error_case");
    if (iVar1 == 1) {
      local_13c = *(uint *)(source + -4);
      iVar1 = tinf_zlib_uncompress
                        (buffer,&local_13c,source,((packed_data *)(source + -8))->src_size);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (iVar1 == 0) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_c_cmakelists/jibsen[P]tinf/test/test_tinf.c";
        greatest_info.fail_line = 0x276;
        greatest_info.msg = "res != TINF_OK";
        iVar1 = -1;
        if ((greatest_info.flags & 4) != 0) goto LAB_00102678;
      }
      else {
        greatest_info.msg = (char *)0x0;
        iVar1 = 0;
      }
      greatest_test_post(iVar1);
    }
    uVar3 = uVar3 + 1;
    source = source + 0x28;
    if (uVar3 == 8) {
      return;
    }
  } while( true );
}

Assistant:

SUITE(tinfzlib)
{
	char suffix[32];
	size_t i;

	RUN_TEST(zlib_empty_raw);
	RUN_TEST(zlib_empty_fixed);
	RUN_TEST(zlib_empty_dynamic);

	RUN_TEST(zlib_onebyte_raw);
	RUN_TEST(zlib_onebyte_fixed);
	RUN_TEST(zlib_onebyte_dynamic);
	RUN_TEST(zlib_zeroes);

	for (i = 0; i < ARRAY_SIZE(zlib_errors); ++i) {
		sprintf(suffix, "%d", (int) i);
		greatest_set_test_suffix(suffix);
		RUN_TEST1(zlib_error_case, &zlib_errors[i]);
	}
}